

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Vec_Int_t * Gia_ManFindSharedInputs(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vRes;
  
  p_00 = Vec_IntStart(p->vCis->nSize);
  vRes = p_00;
  for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
    pGVar2 = Gia_ManCo(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    Gia_ManIncrementTravId(p);
    Gia_ManMarkTfi_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
    for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
      pGVar2 = Gia_ManCi(p,iVar4);
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar2);
      if (iVar1 != 0) {
        Vec_IntAddToEntry(p_00,iVar4,1);
      }
    }
  }
  iVar3 = 0;
  for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar4);
    if (iVar1 == p->vCos->nSize) {
      Vec_IntWriteEntry(p_00,iVar3,iVar4);
      iVar3 = iVar3 + 1;
    }
  }
  if (iVar3 <= p_00->nSize) {
    p_00->nSize = iVar3;
    if (iVar3 == 0 || 10 < iVar3) {
      Vec_IntFreeP(&vRes);
      p_00 = vRes;
    }
    return p_00;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_ManFindSharedInputs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObj2; int i, k, Value;
    Vec_Int_t * vRes = Vec_IntStart( Gia_ManCiNum(p) );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManIncrementTravId( p );
        Gia_ManMarkTfi_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManForEachCi( p, pObj2, k )
            if ( Gia_ObjIsTravIdCurrent(p, pObj2) )
                Vec_IntAddToEntry( vRes, k, 1 );
    }
    k = 0;
    Vec_IntForEachEntry( vRes, Value, i )
        if ( Value == Gia_ManCoNum(p) )
            Vec_IntWriteEntry( vRes, k++, i );
    Vec_IntShrink( vRes, k );
    //printf( "Found %d candidate inputs.\n", Vec_IntSize(vRes) );
    if ( Vec_IntSize(vRes) == 0 || Vec_IntSize(vRes) > 10 )
        Vec_IntFreeP(&vRes);
    return vRes;
}